

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::DoBackgroundParallelMark(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_2a;
  bool parallelSuccess2;
  MarkContext *pMStack_28;
  bool parallelSuccess1;
  MarkContext *splitContexts [2];
  uint actualSplitCount;
  Recycler *this_local;
  
  splitContexts[1]._4_4_ = 0;
  pMStack_28 = &this->parallelMarkContext2;
  splitContexts[0] = &this->parallelMarkContext3;
  if ((this->enableParallelMark & 1U) != 0) {
    if ((this->maxParallelism < 2) || (4 < this->maxParallelism)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xa3d,"(this->maxParallelism > 1 && this->maxParallelism <= 4)",
                         "this->maxParallelism > 1 && this->maxParallelism <= 4");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (2 < this->maxParallelism) {
      splitContexts[1]._4_4_ =
           MarkContext::Split(&this->markContext,this->maxParallelism - 2,&stack0xffffffffffffffd8);
    }
  }
  if (2 < splitContexts[1]._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa44,"(actualSplitCount <= 2)","actualSplitCount <= 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (splitContexts[1]._4_4_ == 0) {
    ProcessMark(this,true);
  }
  else {
    bVar2 = DoQueueTrackedObject(this);
    if ((!bVar2) && ((this->inPartialCollectMode & 1U) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xa4f,"(this->DoQueueTrackedObject() || this->inPartialCollectMode)",
                         "this->DoQueueTrackedObject() || this->inPartialCollectMode");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    SetCollectionState(this,CollectionStateBackgroundParallelMark);
    local_2a = false;
    bVar2 = RecyclerParallelThread::StartConcurrent(&this->parallelThread1);
    if ((bVar2) && (splitContexts[1]._4_4_ == 2)) {
      local_2a = RecyclerParallelThread::StartConcurrent(&this->parallelThread2);
    }
    ProcessParallelMark(this,true,&this->markContext);
    if (bVar2) {
      RecyclerParallelThread::WaitForConcurrent(&this->parallelThread1);
    }
    else {
      ProcessParallelMark(this,true,&this->parallelMarkContext2);
    }
    if (splitContexts[1]._4_4_ == 2) {
      if (local_2a == false) {
        ProcessParallelMark(this,true,&this->parallelMarkContext3);
      }
      else {
        RecyclerParallelThread::WaitForConcurrent(&this->parallelThread2);
      }
    }
    SetCollectionState(this,CollectionStateConcurrentMark);
  }
  return;
}

Assistant:

void
Recycler::DoBackgroundParallelMark()
{
    // Split the mark stack into [this->maxParallelism - 1] equal pieces (thus, "- 2" below).
    // The actual # of splits is returned, in case the stack was too small to split that many ways.
    // The parallel threads are hardwired to use parallelMarkContext2/3, so we split using those.
    uint actualSplitCount = 0;
    MarkContext * splitContexts[2] = { &parallelMarkContext2, &parallelMarkContext3 };
    if (this->enableParallelMark)
    {
        Assert(this->maxParallelism > 1 && this->maxParallelism <= 4);
        if (this->maxParallelism > 2)
        {
            actualSplitCount = markContext.Split(this->maxParallelism - 2, splitContexts);
        }
    }

    Assert(actualSplitCount <= 2);

    // If we failed to split at all, just mark in thread with no parallelism.
    if (actualSplitCount == 0)
    {
        this->ProcessMark(true);
        return;
    }

#if ENABLE_PARTIAL_GC
    // We should already be set up to queue tracked objects, unless this is a partial collect
    Assert(this->DoQueueTrackedObject() || this->inPartialCollectMode);
#else
    Assert(this->DoQueueTrackedObject());
#endif

    this->SetCollectionState(CollectionStateBackgroundParallelMark);

    // Kick off marking on parallel threads too, if there is work for them
    // If the threads haven't been created yet, this will create them (or fail).
    bool parallelSuccess1 = false;
    bool parallelSuccess2 = false;
    parallelSuccess1 = parallelThread1.StartConcurrent();
    if (parallelSuccess1 && actualSplitCount == 2)
    {
        parallelSuccess2 = parallelThread2.StartConcurrent();
    }

    // Process our portion of the split.
    this->ProcessParallelMark(true, &markContext);

    // If we successfully launched parallel work, wait for it to complete.
    // If we failed, then process the work in-thread now.
    if (parallelSuccess1)
    {
        parallelThread1.WaitForConcurrent();
    }
    else
    {
        this->ProcessParallelMark(true, &parallelMarkContext2);
    }

    if (actualSplitCount == 2)
    {
        if (parallelSuccess2)
        {
            parallelThread2.WaitForConcurrent();
        }
        else
        {
            this->ProcessParallelMark(true, &parallelMarkContext3);
        }
    }

    this->SetCollectionState(CollectionStateConcurrentMark);
}